

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psi.cpp
# Opt level: O1

bool __thiscall pg::PSISolver::si_val_less(PSISolver *this,int a,int b)

{
  byte bVar1;
  ulong uVar2;
  uint uVar3;
  long lVar4;
  long lVar5;
  int iVar6;
  int iVar7;
  
  if ((a == b) ||
     ((a != -1 && ((*(int *)(won + (long)a * 4) != 0 || (*(int *)(done + (long)a * 4) == 2)))))) {
LAB_001646d2:
    bVar1 = 0;
  }
  else {
    if (b != -1) {
      bVar1 = 1;
      if ((*(int *)(won + (long)b * 4) != 0) || (*(int *)(done + (long)b * 4) == 2))
      goto LAB_001646d4;
    }
    lVar4 = val + (long)(int)(k * a) * 4;
    if (a == -1) {
      lVar4 = 0;
    }
    uVar2 = (ulong)(int)(k * b);
    lVar5 = val + uVar2 * 4;
    uVar3 = k;
    if (b == -1) {
      lVar5 = 0;
    }
    do {
      iVar6 = 0;
      if ((int)uVar3 < 1) goto LAB_001646d2;
      uVar3 = uVar3 - 1;
      if (a != -1) {
        iVar6 = *(int *)(lVar4 + (ulong)uVar3 * 4);
      }
      if (b == -1) {
        iVar7 = 0;
      }
      else {
        iVar7 = *(int *)(lVar5 + (ulong)uVar3 * 4);
      }
      if (iVar6 != iVar7) {
        if ((uVar3 & 1) == 0) {
          uVar2 = (ulong)(iVar6 < iVar7);
        }
        else {
          uVar2 = (ulong)(iVar7 < iVar6);
        }
      }
      bVar1 = (byte)uVar2;
    } while (iVar6 == iVar7);
  }
LAB_001646d4:
  return (bool)(bVar1 & 1);
}

Assistant:

bool
PSISolver::si_val_less(int a, int b)
{
    // if a == b, then of course return false
    if (a == b) return false;
    // if a is won or on even cycle, then "a >= b"
    if (a != -1 && (won[a] || done[a] == 2)) return false;
    // if b is won or on even cycle and a is not, then "a < b"
    if (b != -1 && (won[b] || done[b] == 2)) return true;
    // neither a/b are won/on even cycle
    int *a_val = a == -1 ? NULL : val + k*a;
    int *b_val = b == -1 ? NULL : val + k*b;
    // find highest priority where they differ
    for (int i=k-1; i>=0; i--) {
        const int a_i = a == -1 ? 0 : a_val[i];
        const int b_i = b == -1 ? 0 : b_val[i];
        if (a_i == b_i) continue;
        if (i&1) return a_i > b_i; // for odd priorities
        else return a_i < b_i;     // for even priorities
    }
    // equal
    return false;
}